

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arsenal.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * AfterburnerUtil::stringToDoubles(string *str)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  vector<double,_std::allocator<double>_> *in_RDI;
  double val;
  stringstream sst;
  vector<double,_std::allocator<double>_> *valueList;
  vector<double,_std::allocator<double>_> *this;
  char *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  string local_1b8 [32];
  stringstream local_198 [408];
  
  this = in_RDI;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                 in_stack_fffffffffffffe30);
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_198,local_1b8,_Var2);
  std::__cxx11::string::~string(local_1b8);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x139308);
  std::istream::operator>>((istream *)local_198,(double *)&stack0xfffffffffffffe30);
  while (bVar1 = std::ios::eof(), (bVar1 & 1) == 0) {
    std::vector<double,_std::allocator<double>_>::push_back(this,(value_type *)in_RDI);
    std::istream::operator>>((istream *)local_198,(double *)&stack0xfffffffffffffe30);
  }
  std::__cxx11::stringstream::~stringstream(local_198);
  return this;
}

Assistant:

std::vector<double> stringToDoubles(std::string str) {
    // Return a vector of doubles from the string "str". "str" should
    // be a string containing a line of data.
    // add a blank at the end so the last data will be read
    std::stringstream sst(str + " ");
    std::vector<double> valueList;
    double val;
    sst >> val;
    while (sst.eof() == false) {
        valueList.push_back(val);
        sst >> val;
    }
    return valueList;
}